

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void MultiplicationHelper<long,_unsigned_long_long,_15>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int64_t *t,uint64_t *u,long *ret)

{
  int64_t tmp;
  uint64_t u1;
  int64_t t1;
  int64_t local_28;
  uint64_t local_20;
  int64_t local_18;
  
  local_18 = *t;
  local_20 = *u;
  local_28 = 0;
  LargeIntRegMultiply<long,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_18,&local_20,&local_28);
  *ret = local_28;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow( const std::int64_t& t, const std::uint64_t& u, T& ret ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64 && safeint_internal::int_traits<U>::isUint64, "T must be Int64, U Uint64");
        std::int64_t t1 = t;
        std::uint64_t u1 = u;
        std::int64_t tmp = 0;
        LargeIntRegMultiply< std::int64_t, std::uint64_t >::template RegMultiplyThrow< E >( t1, u1, &tmp );
        ret = tmp;
    }